

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::error_already_set::restore(error_already_set *this)

{
  PyObject *pPVar1;
  PyObject *pPVar2;
  PyObject **ppPVar3;
  handle local_28;
  handle local_20;
  handle local_18;
  error_already_set *local_10;
  error_already_set *this_local;
  
  local_10 = this;
  local_18 = object::release(&this->m_type);
  ppPVar3 = pybind11::handle::ptr(&local_18);
  pPVar1 = *ppPVar3;
  local_20 = object::release(&this->m_value);
  ppPVar3 = pybind11::handle::ptr(&local_20);
  pPVar2 = *ppPVar3;
  local_28 = object::release(&this->m_trace);
  ppPVar3 = pybind11::handle::ptr(&local_28);
  PyErr_Restore(pPVar1,pPVar2,*ppPVar3);
  return;
}

Assistant:

void restore() { PyErr_Restore(m_type.release().ptr(), m_value.release().ptr(), m_trace.release().ptr()); }